

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O0

void dumpAttribute(raw_ostream *OS,DWARFDie *Die,uint64_t *OffsetPtr,Attribute Attr,Form Form,
                  uint Indent,DIDumpOptions DumpOpts)

{
  uint64_t FileIndex;
  StringRef SVar1;
  DIDumpOptions DVar2;
  undefined8 Obj_00;
  Attribute Attr_00;
  DWARFDie *pDVar3;
  bool bVar4;
  byte bVar5;
  Form FVar6;
  DWARFUnit *U_00;
  DWARFContext *pDVar7;
  LineTable *this;
  unsigned_long *puVar8;
  char *pcVar9;
  raw_ostream *prVar10;
  DWARFUnit *this_00;
  reference Ranges;
  Error *E;
  Optional<unsigned_long> OVar11;
  DWARFDie DVar12;
  bool local_499;
  undefined1 local_3d0 [8];
  string local_3c8;
  undefined1 local_3a8 [8];
  Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
  RangesOrError;
  undefined1 local_370 [8];
  DWARFFormValue FV;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_330;
  Optional<unsigned_long> RangeListOffset;
  DWARFObject *Obj;
  Optional<unsigned_long> OptVal;
  DWARFDie local_2f8;
  char *local_2e8;
  char *Name_1;
  undefined1 local_2d8 [8];
  string Space;
  format_object<unsigned_long> local_260;
  uint64_t local_248;
  uint64_t Index;
  uint64_t HighPC;
  uint64_t LowPC;
  undefined1 local_228;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_220;
  undefined1 local_218;
  WithColor local_210;
  StringRef local_200;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_1f0;
  Optional<unsigned_long> Val;
  char *local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  StringRef local_190;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_180;
  undefined1 local_178;
  LineTable *local_170;
  LineTable *LT;
  undefined1 local_160 [4];
  HighlightColor Color;
  string File;
  StringRef Name;
  DWARFFormValue FormValue;
  DWARFUnit *U;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Attribute_&>_>_>
  local_98;
  WithColor local_48;
  char local_38 [8];
  char BaseIndent [13];
  Attribute local_22;
  uint Indent_local;
  Form Form_local;
  Attribute Attr_local;
  uint64_t *OffsetPtr_local;
  DWARFDie *Die_local;
  raw_ostream *OS_local;
  
  BaseIndent._8_4_ = Indent;
  unique0x100013c8 = Form;
  local_22 = Attr;
  _Indent_local = OffsetPtr;
  OffsetPtr_local = (uint64_t *)Die;
  Die_local = (DWARFDie *)OS;
  bVar4 = llvm::DWARFDie::isValid(Die);
  if (bVar4) {
    builtin_strncpy(BaseIndent,"    ",5);
    builtin_strncpy(local_38,"        ",8);
    llvm::raw_ostream::operator<<((raw_ostream *)Die_local,local_38);
    llvm::raw_ostream::indent((raw_ostream *)Die_local,BaseIndent._8_4_ + 2);
    llvm::WithColor::WithColor(&local_48,(raw_ostream *)Die_local,Attribute,false);
    llvm::formatv<llvm::dwarf::Attribute_&>(&local_98,"{0}",&local_22);
    llvm::WithColor::operator<<(&local_48,&local_98);
    llvm::
    formatv_object<std::tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Attribute_&>_>_>::
    ~formatv_object(&local_98);
    llvm::WithColor::~WithColor(&local_48);
    pDVar3 = Die_local;
    if ((((undefined1  [24])DumpOpts & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) ||
       (((undefined1  [24])DumpOpts & (undefined1  [24])0x10000) != (undefined1  [24])0x0)) {
      llvm::formatv<llvm::dwarf::Form_&>
                ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>_>_>
                  *)&U," [{0}]",(Form *)(BaseIndent + 0xc));
      llvm::raw_ostream::operator<<((raw_ostream *)pDVar3,(formatv_object_base *)&U);
      llvm::formatv_object<std::tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>_>_>
      ::~formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>_>_>
                         *)&U);
    }
    U_00 = llvm::DWARFDie::getDwarfUnit((DWARFDie *)OffsetPtr_local);
    llvm::DWARFFormValue::createFromUnit
              ((DWARFFormValue *)&Name.Length,stack0xffffffffffffffdc,U_00,_Indent_local);
    llvm::raw_ostream::operator<<((raw_ostream *)Die_local,"\t(");
    llvm::StringRef::StringRef((StringRef *)((long)&File.field_2 + 8));
    std::__cxx11::string::string((string *)local_160);
    LT._4_4_ = Enumerator;
    if ((local_22 == DW_AT_decl_file) || (local_22 == DW_AT_call_file)) {
      LT._4_4_ = String;
      pDVar7 = llvm::DWARFUnit::getContext(U_00);
      this = llvm::DWARFContext::getLineTableForUnit(pDVar7,U_00);
      local_170 = this;
      if (this != (LineTable *)0x0) {
        OVar11 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)&Name.Length);
        local_180 = OVar11.Storage.field_0;
        local_178 = OVar11.Storage.hasVal;
        puVar8 = llvm::Optional<unsigned_long>::getValue((Optional<unsigned_long> *)&local_180);
        FileIndex = *puVar8;
        pcVar9 = llvm::DWARFUnit::getCompilationDir(U_00);
        llvm::StringRef::StringRef(&local_190,pcVar9);
        bVar4 = llvm::DWARFDebugLine::LineTable::getFileNameByIndex
                          (this,FileIndex,local_190,AbsoluteFilePath,(string *)local_160);
        if (bVar4) {
          std::operator+(&local_1d0,'\"',
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_160);
          std::operator+(&local_1b0,&local_1d0,'\"');
          std::__cxx11::string::operator=((string *)local_160,(string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_1d0);
          llvm::StringRef::StringRef((StringRef *)&Val.Storage.hasVal,(string *)local_160);
          File.field_2._8_8_ = Val.Storage._8_8_;
          Name.Data = local_1d8;
        }
      }
      SVar1.Length = (size_t)Name.Data;
      SVar1.Data = (char *)File.field_2._8_8_;
    }
    else {
      OVar11 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)&Name.Length);
      local_1f0 = OVar11.Storage.field_0;
      Val.Storage.field_0.empty = OVar11.Storage.hasVal;
      bVar4 = llvm::Optional::operator_cast_to_bool((Optional *)&local_1f0.empty);
      Attr_00 = local_22;
      SVar1.Length = (size_t)Name.Data;
      SVar1.Data = (char *)File.field_2._8_8_;
      if (bVar4) {
        puVar8 = llvm::Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_1f0);
        local_200 = llvm::dwarf::AttributeValueString(Attr_00,(uint)*puVar8);
        SVar1 = local_200;
      }
    }
    Name.Data = (char *)SVar1.Length;
    File.field_2._8_8_ = SVar1.Data;
    bVar4 = llvm::StringRef::empty((StringRef *)((long)&File.field_2 + 8));
    pDVar3 = Die_local;
    if (bVar4) {
      if ((local_22 == DW_AT_decl_line) || (local_22 == DW_AT_call_line)) {
        OVar11 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)&Name.Length);
        local_220 = OVar11.Storage.field_0;
        local_218 = OVar11.Storage.hasVal;
        puVar8 = llvm::Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_220);
        llvm::raw_ostream::operator<<((raw_ostream *)pDVar3,*puVar8);
      }
      else {
        local_499 = false;
        if (((local_22 == DW_AT_high_pc) &&
            (local_499 = false,
            ((undefined1  [24])DumpOpts & (undefined1  [24])0x10000) == (undefined1  [24])0x0)) &&
           (local_499 = false,
           ((undefined1  [24])DumpOpts & (undefined1  [24])0x100000000) == (undefined1  [24])0x0)) {
          OVar11 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)&Name.Length);
          LowPC = (uint64_t)OVar11.Storage.field_0;
          local_228 = OVar11.Storage.hasVal;
          local_499 = llvm::Optional::operator_cast_to_bool((Optional *)&LowPC);
        }
        if (local_499 == false) {
          bVar4 = llvm::DWARFAttribute::mayHaveLocationDescription(local_22);
          DVar2 = DumpOpts;
          if (bVar4) {
            dumpLocation((raw_ostream *)Die_local,(DWARFFormValue *)&Name.Length,U_00,
                         BaseIndent._8_4_ + 0x11,DumpOpts);
          }
          else {
            Space.field_2._8_4_ = DumpOpts.DumpType;
            Space.field_2._12_4_ = DumpOpts.ChildRecurseDepth;
            DumpOpts = DVar2;
            llvm::DWARFFormValue::dump
                      ((DWARFFormValue *)&Name.Length,(raw_ostream *)Die_local,DVar2);
          }
        }
        else if (((undefined1  [24])DumpOpts & (undefined1  [24])0x100000000000000) !=
                 (undefined1  [24])0x0) {
          bVar4 = llvm::DWARFDie::getLowAndHighPC
                            ((DWARFDie *)OffsetPtr_local,&HighPC,&Index,&local_248);
          pDVar3 = Die_local;
          if (bVar4) {
            llvm::format<unsigned_long>(&local_260,"0x%016lx",&Index);
            llvm::raw_ostream::operator<<((raw_ostream *)pDVar3,&local_260.super_format_object_base)
            ;
          }
          else {
            llvm::DWARFFormValue::dump
                      ((DWARFFormValue *)&Name.Length,(raw_ostream *)Die_local,DumpOpts);
          }
        }
      }
    }
    else {
      llvm::WithColor::WithColor(&local_210,(raw_ostream *)Die_local,LT._4_4_,false);
      llvm::WithColor::operator<<(&local_210,(StringRef *)((long)&File.field_2 + 8));
      llvm::WithColor::~WithColor(&local_210);
    }
    pcVar9 = "";
    if (((undefined1  [24])DumpOpts & (undefined1  [24])0x100000000000000) != (undefined1  [24])0x0)
    {
      pcVar9 = " ";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2d8,pcVar9,(allocator<char> *)((long)&Name_1 + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&Name_1 + 7));
    if ((local_22 == DW_AT_specification) || (local_22 == DW_AT_abstract_origin)) {
      local_2f8 = llvm::DWARFDie::getAttributeValueAsReferencedDie
                            ((DWARFDie *)OffsetPtr_local,(DWARFFormValue *)&Name.Length);
      local_2e8 = llvm::DWARFDie::getName(&local_2f8,LinkageName);
      if (local_2e8 != (char *)0x0) {
        prVar10 = llvm::raw_ostream::operator<<((raw_ostream *)Die_local,(string *)local_2d8);
        prVar10 = llvm::raw_ostream::operator<<(prVar10,"\"");
        prVar10 = llvm::raw_ostream::operator<<(prVar10,local_2e8);
        llvm::raw_ostream::operator<<(prVar10,'\"');
      }
    }
    else {
      if (local_22 == DW_AT_type) {
        prVar10 = llvm::raw_ostream::operator<<((raw_ostream *)Die_local,(string *)local_2d8);
        llvm::raw_ostream::operator<<(prVar10,"\"");
        pDVar3 = Die_local;
        DVar12 = llvm::DWARFDie::getAttributeValueAsReferencedDie
                           ((DWARFDie *)OffsetPtr_local,(DWARFFormValue *)&Name.Length);
        OptVal.Storage._8_8_ = DVar12.U;
        dumpTypeName((raw_ostream *)pDVar3,(DWARFDie *)&OptVal.Storage.hasVal);
        llvm::raw_ostream::operator<<((raw_ostream *)Die_local,'\"');
      }
      else if (local_22 == DW_AT_APPLE_property_attribute) {
        OVar11 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)&Name.Length);
        Obj = (DWARFObject *)OVar11.Storage.field_0;
        OptVal.Storage.field_0.empty = OVar11.Storage.hasVal;
        bVar4 = llvm::Optional::operator_cast_to_bool((Optional *)&Obj);
        pDVar3 = Die_local;
        if (bVar4) {
          puVar8 = llvm::Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&Obj);
          dumpApplePropertyAttribute((raw_ostream *)pDVar3,*puVar8);
        }
      }
      else if (local_22 == DW_AT_ranges) {
        this_00 = llvm::DWARFDie::getDwarfUnit((DWARFDie *)OffsetPtr_local);
        pDVar7 = llvm::DWARFUnit::getContext(this_00);
        RangeListOffset.Storage._8_8_ = llvm::DWARFContext::getDWARFObj(pDVar7);
        FVar6 = llvm::DWARFFormValue::getForm((DWARFFormValue *)&Name.Length);
        if (FVar6 == DW_FORM_rnglistx) {
          OVar11 = llvm::DWARFFormValue::getAsSectionOffset((DWARFFormValue *)&Name.Length);
          FV.C = (DWARFContext *)OVar11.Storage.field_0;
          puVar8 = llvm::Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&FV.C);
          OVar11 = llvm::DWARFUnit::getRnglistOffset(U_00,(uint32_t)*puVar8);
          local_330 = OVar11.Storage.field_0;
          RangeListOffset.Storage.field_0.empty = OVar11.Storage.hasVal;
          bVar4 = llvm::Optional::operator_cast_to_bool((Optional *)&local_330.empty);
          if (bVar4) {
            puVar8 = llvm::Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_330)
            ;
            llvm::DWARFFormValue::createFromUValue
                      ((DWARFFormValue *)local_370,DW_FORM_sec_offset,*puVar8);
            DVar2 = DumpOpts;
            RangesOrError._24_4_ = DumpOpts.DumpType;
            RangesOrError._28_4_ = DumpOpts.ChildRecurseDepth;
            DumpOpts = DVar2;
            llvm::DWARFFormValue::dump((DWARFFormValue *)local_370,(raw_ostream *)Die_local,DVar2);
          }
        }
        llvm::DWARFDie::getAddressRanges
                  ((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                    *)local_3a8,(DWARFDie *)OffsetPtr_local);
        bVar4 = llvm::Expected::operator_cast_to_bool((Expected *)local_3a8);
        pDVar3 = Die_local;
        Obj_00 = RangeListOffset.Storage._8_8_;
        if (bVar4) {
          Ranges = llvm::
                   Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                   ::get((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                          *)local_3a8);
          bVar5 = llvm::DWARFUnit::getAddressByteSize(U_00);
          dumpRanges((DWARFObject *)Obj_00,(raw_ostream *)pDVar3,Ranges,(uint)bVar5,
                     BaseIndent._8_4_ + 0x11,&DumpOpts);
        }
        else {
          prVar10 = llvm::WithColor::error();
          prVar10 = llvm::raw_ostream::operator<<(prVar10,"decoding address ranges: ");
          llvm::
          Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
          ::takeError((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                       *)local_3d0);
          llvm::toString_abi_cxx11_((string *)(local_3d0 + 8),(llvm *)local_3d0,E);
          prVar10 = llvm::raw_ostream::operator<<(prVar10,(string *)(local_3d0 + 8));
          llvm::raw_ostream::operator<<(prVar10,'\n');
          std::__cxx11::string::~string((string *)(local_3d0 + 8));
          llvm::Error::~Error((Error *)local_3d0);
        }
        llvm::
        Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
        ~Expected((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                   *)local_3a8);
      }
    }
    llvm::raw_ostream::operator<<((raw_ostream *)Die_local,")\n");
    std::__cxx11::string::~string((string *)local_2d8);
    std::__cxx11::string::~string((string *)local_160);
  }
  return;
}

Assistant:

static void dumpAttribute(raw_ostream &OS, const DWARFDie &Die,
                          uint64_t *OffsetPtr, dwarf::Attribute Attr,
                          dwarf::Form Form, unsigned Indent,
                          DIDumpOptions DumpOpts) {
  if (!Die.isValid())
    return;
  const char BaseIndent[] = "            ";
  OS << BaseIndent;
  OS.indent(Indent + 2);
  WithColor(OS, HighlightColor::Attribute) << formatv("{0}", Attr);

  if (DumpOpts.Verbose || DumpOpts.ShowForm)
    OS << formatv(" [{0}]", Form);

  DWARFUnit *U = Die.getDwarfUnit();
  DWARFFormValue FormValue = DWARFFormValue::createFromUnit(Form, U, OffsetPtr);

  OS << "\t(";

  StringRef Name;
  std::string File;
  auto Color = HighlightColor::Enumerator;
  if (Attr == DW_AT_decl_file || Attr == DW_AT_call_file) {
    Color = HighlightColor::String;
    if (const auto *LT = U->getContext().getLineTableForUnit(U))
      if (LT->getFileNameByIndex(
              FormValue.getAsUnsignedConstant().getValue(),
              U->getCompilationDir(),
              DILineInfoSpecifier::FileLineInfoKind::AbsoluteFilePath, File)) {
        File = '"' + File + '"';
        Name = File;
      }
  } else if (Optional<uint64_t> Val = FormValue.getAsUnsignedConstant())
    Name = AttributeValueString(Attr, *Val);

  if (!Name.empty())
    WithColor(OS, Color) << Name;
  else if (Attr == DW_AT_decl_line || Attr == DW_AT_call_line)
    OS << *FormValue.getAsUnsignedConstant();
  else if (Attr == DW_AT_high_pc && !DumpOpts.ShowForm && !DumpOpts.Verbose &&
           FormValue.getAsUnsignedConstant()) {
    if (DumpOpts.ShowAddresses) {
      // Print the actual address rather than the offset.
      uint64_t LowPC, HighPC, Index;
      if (Die.getLowAndHighPC(LowPC, HighPC, Index))
        OS << format("0x%016" PRIx64, HighPC);
      else
        FormValue.dump(OS, DumpOpts);
    }
  } else if (DWARFAttribute::mayHaveLocationDescription(Attr))
    dumpLocation(OS, FormValue, U, sizeof(BaseIndent) + Indent + 4, DumpOpts);
  else
    FormValue.dump(OS, DumpOpts);

  std::string Space = DumpOpts.ShowAddresses ? " " : "";

  // We have dumped the attribute raw value. For some attributes
  // having both the raw value and the pretty-printed value is
  // interesting. These attributes are handled below.
  if (Attr == DW_AT_specification || Attr == DW_AT_abstract_origin) {
    if (const char *Name =
            Die.getAttributeValueAsReferencedDie(FormValue).getName(
                DINameKind::LinkageName))
      OS << Space << "\"" << Name << '\"';
  } else if (Attr == DW_AT_type) {
    OS << Space << "\"";
    dumpTypeName(OS, Die.getAttributeValueAsReferencedDie(FormValue));
    OS << '"';
  } else if (Attr == DW_AT_APPLE_property_attribute) {
    if (Optional<uint64_t> OptVal = FormValue.getAsUnsignedConstant())
      dumpApplePropertyAttribute(OS, *OptVal);
  } else if (Attr == DW_AT_ranges) {
    const DWARFObject &Obj = Die.getDwarfUnit()->getContext().getDWARFObj();
    // For DW_FORM_rnglistx we need to dump the offset separately, since
    // we have only dumped the index so far.
    if (FormValue.getForm() == DW_FORM_rnglistx)
      if (auto RangeListOffset =
              U->getRnglistOffset(*FormValue.getAsSectionOffset())) {
        DWARFFormValue FV = DWARFFormValue::createFromUValue(
            dwarf::DW_FORM_sec_offset, *RangeListOffset);
        FV.dump(OS, DumpOpts);
      }
    if (auto RangesOrError = Die.getAddressRanges())
      dumpRanges(Obj, OS, RangesOrError.get(), U->getAddressByteSize(),
                 sizeof(BaseIndent) + Indent + 4, DumpOpts);
    else
      WithColor::error() << "decoding address ranges: "
                         << toString(RangesOrError.takeError()) << '\n';
  }

  OS << ")\n";
}